

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall
Minisat::Solver::shareViaCallback<Minisat::vec<Minisat::Lit>>
          (Solver *this,vec<Minisat::Lit> *v,int lbd)

{
  Lit LVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Lit *pLVar6;
  reference pvVar7;
  uchar *puVar8;
  int in_EDX;
  size_t *siglen;
  size_t *siglen_00;
  vec<Minisat::Lit> *in_RSI;
  uchar *puVar9;
  long in_RDI;
  size_t in_R8;
  Lit lit_1;
  int i_1;
  Lit lit;
  int i;
  bool filled_buffer;
  int local_88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  int local_58;
  uint local_30;
  uint local_1c;
  
  if ((in_EDX <= *(int *)(in_RDI + 0x4b8)) &&
     (iVar4 = vec<Minisat::Lit>::size(in_RSI), iVar4 <= *(int *)(in_RDI + 0x704))) {
    bVar3 = false;
    if ((*(long *)(in_RDI + 0x568) != 0) &&
       (iVar4 = vec<Minisat::Lit>::size(in_RSI), iVar4 <= *(int *)(in_RDI + 0x560))) {
      vec<Minisat::Lit>::size(in_RSI);
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      local_1c = 0;
      while( true ) {
        uVar5 = vec<Minisat::Lit>::size(in_RSI);
        puVar8 = (uchar *)(ulong)uVar5;
        if ((int)uVar5 <= (int)local_1c) break;
        puVar9 = (uchar *)(ulong)local_1c;
        pLVar6 = vec<Minisat::Lit>::operator[](in_RSI,local_1c);
        LVar1.x = pLVar6->x;
        uVar5 = sign((EVP_PKEY_CTX *)(ulong)(uint)LVar1.x,puVar9,siglen,puVar8,in_R8);
        if ((uVar5 & 1) == 0) {
          local_58 = var(LVar1);
          local_58 = local_58 + 1;
        }
        else {
          iVar4 = var(LVar1);
          local_58 = -(iVar4 + 1);
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x548),
                            (long)(int)local_1c);
        *pvVar7 = local_58;
        local_1c = local_1c + 1;
      }
      in_stack_ffffffffffffff88 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x548);
      iVar4 = vec<Minisat::Lit>::size(in_RSI);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_ffffffffffffff88,(long)iVar4);
      *pvVar7 = 0;
      bVar3 = true;
      pcVar2 = *(code **)(in_RDI + 0x568);
      in_stack_ffffffffffffff90 = *(vector<int,_std::allocator<int>_> **)(in_RDI + 0x540);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x548),0);
      (*pcVar2)(in_stack_ffffffffffffff90,pvVar7);
    }
    if ((((*(byte *)(in_RDI + 0x700) & 1) != 0) && (*(long *)(in_RDI + 0x710) != 0)) &&
       ((iVar4 = vec<Minisat::Lit>::size(in_RSI), iVar4 < 3 || (in_EDX <= *(int *)(in_RDI + 0x4b8)))
       )) {
      vec<Minisat::Lit>::size(in_RSI);
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      if (!bVar3) {
        local_30 = 0;
        while( true ) {
          uVar5 = vec<Minisat::Lit>::size(in_RSI);
          puVar8 = (uchar *)(ulong)uVar5;
          if ((int)uVar5 <= (int)local_30) break;
          puVar9 = (uchar *)(ulong)local_30;
          pLVar6 = vec<Minisat::Lit>::operator[](in_RSI,local_30);
          LVar1.x = pLVar6->x;
          uVar5 = sign((EVP_PKEY_CTX *)(ulong)(uint)LVar1.x,puVar9,siglen_00,puVar8,in_R8);
          if ((uVar5 & 1) == 0) {
            local_88 = var(LVar1);
            local_88 = local_88 + 1;
          }
          else {
            iVar4 = var(LVar1);
            local_88 = -(iVar4 + 1);
          }
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x548),
                              (long)(int)local_30);
          *pvVar7 = local_88;
          local_30 = local_30 + 1;
        }
      }
      (**(code **)(in_RDI + 0x710))(in_RDI + 0x548,in_EDX,*(undefined8 *)(in_RDI + 0x720));
    }
  }
  return;
}

Assistant:

inline void Solver::shareViaCallback(const V &v, int lbd)
{
    if (lbd > core_lbd_cut) return;
    if (v.size() > share_clause_max_size) return;

    bool filled_buffer = false;

    if (learnCallback != 0 && v.size() <= learnCallbackLimit) {
        learnCallbackBuffer.resize(v.size() + 1);
        for (int i = 0; i < v.size(); i++) {
            Lit lit = v[i];
            learnCallbackBuffer[i] = sign(lit) ? -(var(lit) + 1) : (var(lit) + 1);
        }
        learnCallbackBuffer[v.size()] = 0;
        filled_buffer = true;
        learnCallback(learnCallbackState, &(learnCallbackBuffer[0]));
    }

    /* share only limited clauses in parallel solving! */
    if (share_parallel && learnedClsCallback != 0 && (v.size() < 3 || lbd <= core_lbd_cut)) {
        learnCallbackBuffer.resize(v.size());
        if (!filled_buffer) {
            for (int i = 0; i < v.size(); i++) {
                Lit lit = v[i];
                learnCallbackBuffer[i] = sign(lit) ? -(var(lit) + 1) : (var(lit) + 1);
            }
        }
        learnedClsCallback(learnCallbackBuffer, lbd, issuer);
    }
}